

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

Curl_addrinfo * ainext(connectdata *conn,int tempindex,_Bool next)

{
  bool bVar1;
  Curl_addrinfo *local_20;
  Curl_addrinfo *ai;
  _Bool next_local;
  int tempindex_local;
  connectdata *conn_local;
  
  local_20 = conn->tempaddr[tempindex];
  if ((local_20 != (Curl_addrinfo *)0x0) && (next)) {
    local_20 = local_20->ai_next;
  }
  while( true ) {
    bVar1 = false;
    if (local_20 != (Curl_addrinfo *)0x0) {
      bVar1 = local_20->ai_family != conn->tempfamily[tempindex];
    }
    if (!bVar1) break;
    local_20 = local_20->ai_next;
  }
  conn->tempaddr[tempindex] = local_20;
  return local_20;
}

Assistant:

static struct Curl_addrinfo *ainext(struct connectdata *conn,
                                    int tempindex,
                                    bool next) /* use next entry? */
{
  struct Curl_addrinfo *ai = conn->tempaddr[tempindex];
  if(ai && next)
    ai = ai->ai_next;
  while(ai && (ai->ai_family != conn->tempfamily[tempindex]))
    ai = ai->ai_next;
  conn->tempaddr[tempindex] = ai;
  return ai;
}